

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryfFFT
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  pointer pcVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  _Base_ptr p_Var5;
  undefined1 auVar6 [16];
  double dVar7;
  _Alloc_hider _Var8;
  undefined8 *puVar9;
  invalid_argument *this;
  long *plVar10;
  char *__function;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  Index size;
  double *pdVar18;
  VectorXcd FourierCoeffs;
  ArrayXd ChebCoeffs;
  FFT<double,_Eigen::default_fft_impl<double>_> fft;
  double *local_1c8;
  _Base_ptr p_Stack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  double local_168;
  double local_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [24];
  _Base_ptr local_138;
  size_t sStack_130;
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
  local_128;
  pointer pcStack_f8;
  pointer local_f0;
  pointer pcStack_e8;
  pointer local_e0;
  pointer pcStack_d8;
  pointer local_d0;
  FFT<double,_Eigen::default_fft_impl<double>_> local_c8;
  
  uVar4 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_168 = xmin;
  local_160 = xmax;
  if (uVar4 != N + 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              ((string *)&local_1c8,
               (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
    ;
    std::operator+(&local_1a8,"Size of f [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_158 = (undefined1  [8])*plVar10;
    pdVar12 = (double *)(plVar10 + 2);
    if (local_158 == (undefined1  [8])pdVar12) {
      auStack_150._8_8_ = *pdVar12;
      auStack_150._16_8_ = plVar10[3];
      local_158 = (undefined1  [8])(auStack_150 + 8);
    }
    else {
      auStack_150._8_8_ = *pdVar12;
    }
    auStack_150._0_8_ = plVar10[1];
    *plVar10 = (long)pdVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::to_string(&local_188,N);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_188);
    std::invalid_argument::invalid_argument(this,(string *)&local_c8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  if ((long)uVar4 < 1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar2 = uVar4 * 2 - 2;
  _Var8._M_p = local_1a8._M_dataplus._M_p;
  if (uVar2 != 0) {
    if (0x1fffffffffffffff < uVar2) {
LAB_00109a4a:
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = operator_new;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    _Var8._M_p = (pointer)malloc(uVar2 * 8);
    if (((ulong)_Var8._M_p & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (_Var8._M_p == (pointer)0x0) goto LAB_00109a4a;
  }
  local_1a8._M_dataplus._M_p = _Var8._M_p;
  local_1a8._M_string_length = uVar2;
  if (uVar4 <= uVar2) {
    pdVar12 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar11 = uVar4 & 0x7ffffffffffffffe;
    if (uVar4 != 1) {
      uVar13 = 0;
      do {
        pdVar18 = pdVar12 + uVar13;
        dVar7 = pdVar18[1];
        *(double *)(local_1a8._M_dataplus._M_p + uVar13 * 8) = *pdVar18;
        *(double *)((long)(local_1a8._M_dataplus._M_p + uVar13 * 8) + 8) = dVar7;
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar11);
    }
    if ((long)uVar11 < (long)uVar4) {
      do {
        *(double *)(local_1a8._M_dataplus._M_p + uVar11 * 8) = pdVar12[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
    }
    lVar15 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar15 < 2) {
      __function = 
      "Eigen::Block<const Eigen::Reverse<const Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Reverse<const Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00109b52;
    }
    uVar4 = lVar15 - 2;
    if (-1 < (long)(uVar2 - uVar4 | uVar4)) {
      pcVar1 = local_1a8._M_dataplus._M_p + (uVar2 - uVar4) * 8;
      uVar11 = uVar4;
      if ((((ulong)pcVar1 & 7) == 0) &&
         (uVar11 = (ulong)((uint)((ulong)pcVar1 >> 3) & 1), uVar4 <= uVar11)) {
        uVar11 = uVar4;
      }
      pdVar12 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      lVar16 = uVar4 - uVar11;
      if (uVar11 != 0) {
        pdVar18 = pdVar12 + lVar15 + -2;
        uVar13 = 0;
        do {
          *(double *)(pcVar1 + uVar13 * 8) = *pdVar18;
          uVar13 = uVar13 + 1;
          pdVar18 = pdVar18 + -1;
        } while (uVar11 != uVar13);
      }
      lVar14 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
      if (1 < lVar16) {
        pauVar17 = (undefined1 (*) [16])(pdVar12 + ((lVar15 + -3) - uVar11));
        uVar13 = uVar11;
        do {
          auVar3 = *pauVar17;
          auVar6._8_4_ = auVar3._0_4_;
          auVar6._0_8_ = auVar3._8_8_;
          auVar6._12_4_ = auVar3._4_4_;
          *(undefined1 (*) [16])(pcVar1 + uVar13 * 8) = auVar6;
          uVar13 = uVar13 + 2;
          pauVar17 = pauVar17 + -1;
        } while ((long)uVar13 < lVar14);
      }
      if (lVar14 < (long)uVar4) {
        pdVar12 = pdVar12 + (lVar16 / 2) * -2 + ((lVar15 + -2) - uVar11);
        lVar15 = (lVar14 - lVar15) + 2;
        do {
          *(double *)(local_1a8._M_dataplus._M_p + lVar15 * 8 + uVar2 * 8) = *pdVar12;
          pdVar12 = pdVar12 + -1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0);
      }
      auStack_150._16_8_ = auStack_150;
      auStack_150._8_8_ = (_Base_ptr)0x0;
      sStack_130 = 0;
      local_128._M_impl._0_8_ = 0;
      local_158 = (undefined1  [8])0x0;
      auStack_150._0_8_ = 0;
      local_128._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_128._M_impl.super__Rb_tree_header._M_header;
      local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_128._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcStack_f8 = (pointer)0x0;
      local_f0 = (pointer)0x0;
      pcStack_e8 = (pointer)0x0;
      local_e0 = (pointer)0x0;
      pcStack_d8 = (pointer)0x0;
      local_d0 = (pointer)0x0;
      local_138 = (_Base_ptr)auStack_150._16_8_;
      local_128._M_impl.super__Rb_tree_header._M_header._M_right =
           local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      Eigen::FFT<double,_Eigen::default_fft_impl<double>_>::FFT
                (&local_c8,(impl_type *)local_158,Default);
      if (local_e0 != (pointer)0x0) {
        operator_delete(local_e0,(long)local_d0 - (long)local_e0);
      }
      if (pcStack_f8 != (pointer)0x0) {
        operator_delete(pcStack_f8,(long)pcStack_e8 - (long)pcStack_f8);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
                   *)local_158);
      local_1c8 = (double *)0x0;
      p_Stack_1c0 = (_Base_ptr)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
                 &local_1c8,
                 (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows * 2 + -2);
      Eigen::FFT<double,Eigen::default_fft_impl<double>>::
      fwd<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
                ((FFT<double,Eigen::default_fft_impl<double>> *)&local_c8,
                 (MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&local_1c8,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a8,-1);
      p_Var5 = (_Base_ptr)
               (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((long)p_Var5 < 0 && local_1c8 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>, Level = 0]"
                     );
      }
      if ((-1 < (long)p_Var5) && ((long)p_Var5 <= (long)p_Stack_1c0)) {
        local_128._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)p_Stack_1c0 * 2 & 0x1ffffffffffffffe;
        local_128._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)(double)(long)((long)&p_Var5[-1]._M_right + 7);
        local_158 = (undefined1  [8])local_1c8;
        sStack_130 = 0;
        auStack_150._0_8_ = p_Var5;
        auStack_150._16_8_ = (_Base_ptr)&local_1c8;
        local_128._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var5;
        Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_188,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)local_158);
        if ((long)local_188._M_string_length < 1) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                       );
        }
        *(double *)local_188._M_dataplus._M_p = *(double *)local_188._M_dataplus._M_p * 0.5;
        *(double *)(local_188._M_dataplus._M_p + local_188._M_string_length * 8 + -8) =
             *(double *)(local_188._M_dataplus._M_p + local_188._M_string_length * 8 + -8) * 0.5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_158,
                   (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_188);
        ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_158,local_168,local_160);
        free((void *)local_158);
        free(local_188._M_dataplus._M_p);
        free(local_1c8);
        if (local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
        ::~_Rb_tree(&local_c8.m_impl.super_kissfft_impl<double>.m_realTwiddles._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
                     *)&local_c8);
        free(local_1a8._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      __function = 
      "Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00109b52;
    }
  }
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00109b52:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,__function);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryfFFT(const std::size_t N, const Eigen::VectorXd& f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        Eigen::VectorXd valsUnitDisc(2 * f.size() - 2);
        // Starting at x = 1, going to -1, then the same nodes, not including x=-1 and x=1, in the opposite order
        valsUnitDisc.head(f.size()) = f;
        valsUnitDisc.tail(f.size() - 2) = f.reverse().segment(1, f.size() - 2);
        
        Eigen::FFT<double> fft;
        Eigen::VectorXcd FourierCoeffs(2 * f.size() - 2);
        fft.fwd(FourierCoeffs, valsUnitDisc);
        auto n = f.size() - 1;
        Eigen::ArrayXd ChebCoeffs = FourierCoeffs.real().head(n+1)/n;
        ChebCoeffs[0] /= 2;
        ChebCoeffs[ChebCoeffs.size()-1] /= 2;

        return ChebyshevExpansion(ChebCoeffs, xmin, xmax);
    }